

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SizePolicy.cpp
# Opt level: O0

uint PrimePolicy::GetPrime(uint min,int *modFunctionIndex)

{
  uint uVar1;
  bool bVar2;
  uint candidate;
  uint local_24;
  uint i_1;
  uint prime;
  int i;
  int *modFunctionIndex_local;
  uint min_local;
  
  candidate = (uint)modFunctionIndex;
  if (min == 0) {
    *modFunctionIndex = 3;
    modFunctionIndex_local._4_4_ = 0x11;
  }
  else {
    for (i_1 = 0; i_1 < 0x4b; i_1 = i_1 + 1) {
      uVar1 = primes[(int)i_1];
      if (min <= uVar1) {
        *modFunctionIndex = i_1;
        return uVar1;
      }
    }
    *modFunctionIndex = 0x4b;
    for (local_24 = min | 1; modFunctionIndex_local._4_4_ = min, local_24 < 0x7fffffff;
        local_24 = local_24 + 2) {
      bVar2 = IsPrime((PrimePolicy *)(ulong)local_24,candidate);
      if (bVar2) {
        return local_24;
      }
    }
  }
  return modFunctionIndex_local._4_4_;
}

Assistant:

uint
PrimePolicy::GetPrime(uint min, int *modFunctionIndex)
{
    if (min <= 0)
    {
        *modFunctionIndex = 3;
        AssertMsg(primes[3] == 17, "Update modFunctionIndex for 17");
        return 17;
    }

    for (int i = 0; i < sizeof(primes)/sizeof(uint); i++)
    {
        uint prime = primes[i];
        if (prime >= min)
        {
            *modFunctionIndex = i;
            return prime;
        }
    }

    *modFunctionIndex = UNKNOWN_MOD_INDEX;
    //outside of our predefined table.
    //compute the hard way.
    for (uint i = (min | 1); i < 0x7FFFFFFF; i += 2)
    {
        if (IsPrime(i))
        {
            return i;
        }
    }
    return min;
}